

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-mqtt-handshake.c
# Opt level: O1

lws * lws_mqtt_client_send_connect(lws *wsi)

{
  byte bVar1;
  uint16_t u;
  ushort uVar2;
  _lws_mqtt_related *p_Var3;
  lws_mqtt_str_t *plVar4;
  lws_mqtt_str_t *plVar5;
  byte bVar6;
  int iVar7;
  char cVar8;
  long lVar9;
  char *format;
  int iVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  uint8_t b [272];
  uint8_t local_138;
  uint8_t local_137 [6];
  uint8_t auStack_131 [257];
  
  if ((short)wsi->wsistate != 0x121) {
    _lws_log(1,"%s: unexpected state %d\n","lws_mqtt_client_send_connect");
    return (lws *)0x0;
  }
  p_Var3 = wsi->mqtt;
  iVar7 = lws_mqtt_fill_fixed_header(&local_138,LMQCP_CTOS_CONNECT,'\0',QOS0,'\0');
  if (iVar7 != 0) {
    format = "%s: Failled to fill fixed header\n";
    goto LAB_0011e18f;
  }
  cVar8 = (char)((p_Var3->client).id)->len;
  bVar6 = cVar8 + 0xc;
  bVar1 = (p_Var3->client).conn_flags;
  if ((((char)bVar1 < '\0') && (plVar4 = (p_Var3->client).username, plVar4 != (lws_mqtt_str_t *)0x0)
      ) && (bVar6 = cVar8 + (char)plVar4->len + 0xe, (bVar1 & 0x40) != 0)) {
    plVar4 = (p_Var3->client).password;
    if (plVar4 == (lws_mqtt_str_t *)0x0) {
      cVar8 = '\x02';
    }
    else {
      cVar8 = (char)plVar4->len + '\x02';
    }
    bVar6 = cVar8 + bVar6;
  }
  if (((bVar1 & 4) != 0) && (plVar4 = (p_Var3->client).will.topic, plVar4 != (lws_mqtt_str_t *)0x0))
  {
    plVar5 = (p_Var3->client).will.message;
    if (plVar5 == (lws_mqtt_str_t *)0x0) {
      cVar8 = '\x02';
    }
    else {
      cVar8 = (char)plVar5->len + '\x02';
    }
    bVar6 = bVar6 + (char)plVar4->len + cVar8 + 2;
  }
  iVar7 = lws_mqtt_vbi_encode((uint)bVar6,local_137);
  lVar9 = (long)iVar7;
  puVar11 = local_137 + lVar9;
  lws_ser_wu16be(puVar11,4);
  builtin_memcpy(local_137 + lVar9 + 2,"MQTT",4);
  auStack_131[lVar9] = '\x04';
  auStack_131[lVar9 + 1] = (p_Var3->client).conn_flags;
  lws_ser_wu16be(auStack_131 + lVar9 + 2,(p_Var3->client).keep_alive_secs);
  plVar4 = (p_Var3->client).id;
  if (((plVar4 == (lws_mqtt_str_t *)0x0) || (plVar4->len == 0)) ||
     ((plVar4->buf == (uint8_t *)0x0 || (*plVar4->buf == '\0')))) {
    if (((p_Var3->client).conn_flags & 2) == 0) {
      format = "%s: Empty client ID needs a clean start\n";
      goto LAB_0011e18f;
    }
    auStack_131[lVar9 + 4] = '\0';
    puVar11 = auStack_131 + lVar9 + 5;
  }
  else {
    lws_ser_wu16be(auStack_131 + lVar9 + 4,plVar4->len);
    plVar4 = (p_Var3->client).id;
    memcpy(auStack_131 + lVar9 + 6,plVar4->buf,(ulong)plVar4->len);
    puVar11 = puVar11 + (ulong)((p_Var3->client).id)->len + 0xc;
  }
  bVar6 = (p_Var3->client).conn_flags;
  if ((bVar6 & 0xfd) == 0) {
    *puVar11 = '\0';
    puVar12 = puVar11 + 1;
LAB_0011df92:
    iVar10 = (int)puVar12 - (int)&local_138;
    iVar7 = lws_write(wsi,&local_138,(long)iVar10,LWS_WRITE_BINARY);
    if (iVar7 == iVar10) {
      return wsi;
    }
    format = "%s: write failed\n";
    iVar7 = 4;
  }
  else {
    if ((bVar6 & 4) != 0) {
      plVar4 = (p_Var3->client).will.topic;
      if ((((plVar4 == (lws_mqtt_str_t *)0x0) || (plVar4->len == 0)) ||
          (plVar4->buf == (uint8_t *)0x0)) || (*plVar4->buf == '\0')) {
        format = "%s: Missing Will Topic\n";
        goto LAB_0011e18f;
      }
      lws_ser_wu16be(puVar11,plVar4->len);
      plVar4 = (p_Var3->client).will.topic;
      memcpy(puVar11 + 2,plVar4->buf,(ulong)plVar4->len);
      plVar4 = (p_Var3->client).will.message;
      u = ((p_Var3->client).will.topic)->len;
      puVar12 = puVar11 + (ulong)u + 2;
      if (((plVar4 == (lws_mqtt_str_t *)0x0) || (plVar4->len == 0)) ||
         ((plVar4->buf == (uint8_t *)0x0 || (*plVar4->buf == '\0')))) {
        lws_ser_wu16be(puVar12,0);
        puVar11 = puVar11 + (ulong)u + 4;
      }
      else {
        lws_ser_wu16be(puVar12,u);
        plVar4 = (p_Var3->client).will.message;
        memcpy(puVar11 + (ulong)u + 4,plVar4->buf,(ulong)plVar4->len);
        puVar11 = puVar12 + (ulong)((p_Var3->client).will.message)->len + 2;
      }
    }
    bVar6 = (p_Var3->client).conn_flags;
    if ((char)bVar6 < '\0') {
      plVar4 = (p_Var3->client).username;
      if (((plVar4 != (lws_mqtt_str_t *)0x0) && (plVar4->len != 0)) &&
         ((plVar4->buf != (uint8_t *)0x0 && (*plVar4->buf != '\0')))) {
        lws_ser_wu16be(puVar11,plVar4->len);
        plVar4 = (p_Var3->client).username;
        memcpy(puVar11 + 2,plVar4->buf,(ulong)plVar4->len);
        uVar2 = ((p_Var3->client).username)->len;
        puVar12 = puVar11 + (ulong)uVar2 + 2;
        if (((p_Var3->client).conn_flags & 0x40) != 0) {
          plVar4 = (p_Var3->client).password;
          if ((((plVar4 == (lws_mqtt_str_t *)0x0) || (plVar4->len == 0)) ||
              (plVar4->buf == (uint8_t *)0x0)) || (*plVar4->buf == '\0')) {
            lws_ser_wu16be(puVar12,0);
            puVar12 = puVar11 + (ulong)uVar2 + 4;
          }
          else {
            lws_ser_wu16be(puVar12,plVar4->len);
            plVar4 = (p_Var3->client).password;
            memcpy(puVar11 + (ulong)uVar2 + 4,plVar4->buf,(ulong)plVar4->len);
            puVar12 = puVar12 + (ulong)((p_Var3->client).password)->len + 2;
          }
        }
        goto LAB_0011df92;
      }
      format = "%s: Empty / missing Username!\n";
    }
    else {
      puVar12 = puVar11;
      if (bVar6 < 0x40) goto LAB_0011df92;
      format = "%s: Unsupported - Password without username\n";
    }
LAB_0011e18f:
    iVar7 = 1;
  }
  _lws_log(iVar7,format,"lws_mqtt_client_send_connect");
  return (lws *)0x0;
}

Assistant:

struct lws *
lws_mqtt_client_send_connect(struct lws *wsi)
{
	/* static int */
	/* 	lws_mqttc_abs_writeable(lws_abs_protocol_inst_t *api, size_t budget) */
	const lws_mqttc_t *c = &wsi->mqtt->client;
	uint8_t b[256 + LWS_PRE], *start = b + LWS_PRE, *p = start,
		len = MQTT_CONNECT_MSG_BASE_LEN;

	switch (lwsi_state(wsi)) {
	case LRS_MQTTC_IDLE:
		/*
		 * Transport connected - this is our chance to do the
		 * protocol connect action.
		 */

		/* 1. Fixed Headers */
		if (lws_mqtt_fill_fixed_header(p++, LMQCP_CTOS_CONNECT, 0, 0, 0)) {
			lwsl_err("%s: Failled to fill fixed header\n", __func__);
			return NULL;
		}

		/*
		 * 2. Remaining length - Add the lengths of client ID,
		 * username and password and their length fields if
		 * the respective flags are set.
		 */
		len +=  c->id->len;
		if (c->conn_flags & LMQCFT_USERNAME && c->username) {
			len += c->username->len + 2;
			if (c->conn_flags & LMQCFT_PASSWORD)
				len += (c->password ? c->password->len : 0) + 2;
		}
		if (c->conn_flags & LMQCFT_WILL_FLAG && c->will.topic) {
			len += c->will.topic->len + 2;
			len += (c->will.message ? c->will.message->len : 0) + 2;
		}
		p += lws_mqtt_vbi_encode(len, p);

		/*
		 * 3. Variable Header - Protocol name & level, Connect
		 * flags and keep alive time (in secs).
		 */
		lws_ser_wu16be(p, 4); /* Length of protocol name */
		p += 2;
		*p++ = 'M';
		*p++ = 'Q';
		*p++ = 'T';
		*p++ = 'T';
		*p++ = MQTT_VER_3_1_1;
		*p++ = c->conn_flags;
		lws_ser_wu16be(p, c->keep_alive_secs);
		p += 2;

		/*
		 * 4. Payload - Client ID, Will topic & message,
		 * Username & password.
		 */
		if (lws_mqtt_str_is_not_empty(c->id)) {
			lws_ser_wu16be(p, c->id->len);
			p += 2;
			memcpy(p, c->id->buf, c->id->len);
			p += c->id->len;
		} else {
			/*
			 * If the Client supplies a zero-byte
			 * ClientId, the Client MUST also set
			 * CleanSession to 1 [MQTT-3.1.3-7].
			 */
			if (!(c->conn_flags & LMQCFT_CLEAN_START)) {
				lwsl_err("%s: Empty client ID needs a clean start\n",
					 __func__);
				return NULL;
			}
			*p++ = 0;
		}

		if ((c->conn_flags & ~LMQCFT_CLEAN_START) == 0) {
			*p++ = 0; /* no properties */
			break;
		}
		if (c->conn_flags & LMQCFT_WILL_FLAG) {
			if (lws_mqtt_str_is_not_empty(c->will.topic)) {
				lws_ser_wu16be(p, c->will.topic->len);
				p += 2;
				memcpy(p, c->will.topic->buf, c->will.topic->len);
				p += c->will.topic->len;
				if (lws_mqtt_str_is_not_empty(c->will.message)) {
					lws_ser_wu16be(p, c->will.topic->len);
					p += 2;
					memcpy(p, c->will.message->buf,
					       c->will.message->len);
					p += c->will.message->len;
				} else {
					lws_ser_wu16be(p, 0);
					p += 2;
				}
			} else {
				lwsl_err("%s: Missing Will Topic\n", __func__);
				return NULL;
			}
		}
		if (c->conn_flags & LMQCFT_USERNAME) {
			/*
			 * Detailed sanity check on the username and
			 * password strings.
			 */
			if (lws_mqtt_str_is_not_empty(c->username)) {
				lws_ser_wu16be(p, c->username->len);
				p += 2;
				memcpy(p, c->username->buf, c->username->len);
				p += c->username->len;
			} else {
				lwsl_err("%s: Empty / missing Username!\n",
					 __func__);
				return NULL;
			}
			if (c->conn_flags & LMQCFT_PASSWORD) {
				if (lws_mqtt_str_is_not_empty(c->password)) {
					lws_ser_wu16be(p, c->password->len);
					p += 2;
					memcpy(p, c->password->buf,
					       c->password->len);
					p += c->password->len;
				} else {
					lws_ser_wu16be(p, 0);
					p += 2;
				}
			}
		} else if (c->conn_flags & LMQCFT_PASSWORD) {
			lwsl_err("%s: Unsupported - Password without username\n",
				 __func__);
			return NULL;
		}
		break;
	default:
		lwsl_err("%s: unexpected state %d\n", __func__, lwsi_state(wsi));

		return NULL;
	}

	/*
	 * Perform the actual write
	 */
	if (lws_write(wsi, (unsigned char *)&b[LWS_PRE], lws_ptr_diff(p, start),
		  LWS_WRITE_BINARY) != lws_ptr_diff(p, start)) {
		lwsl_notice("%s: write failed\n", __func__);

		return NULL;
	}

	return wsi;
}